

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# storage.c
# Opt level: O0

settings_w * open_settings_w(char *sessionname,char **errmsg)

{
  char *pcVar1;
  char *pcVar2;
  char *pcVar3;
  FILE *pFVar4;
  int *piVar5;
  settings_w *toret;
  FILE *fp;
  char *err;
  char *filename;
  char **errmsg_local;
  char *sessionname_local;
  
  *errmsg = (char *)0x0;
  pcVar1 = make_filename(0,(char *)0x0);
  pcVar2 = make_dir_path(pcVar1,0x1c0);
  if (pcVar2 == (char *)0x0) {
    safefree(pcVar1);
    pcVar1 = make_filename(4,(char *)0x0);
    pcVar2 = make_dir_path(pcVar1,0x1c0);
    if (pcVar2 == (char *)0x0) {
      safefree(pcVar1);
      pcVar1 = make_filename(5,sessionname);
      pFVar4 = fopen(pcVar1,"w");
      if (pFVar4 == (FILE *)0x0) {
        piVar5 = __errno_location();
        pcVar2 = strerror(*piVar5);
        pcVar2 = dupprintf("Unable to save session: open(\"%s\") returned \'%s\'",pcVar1,pcVar2);
        *errmsg = pcVar2;
        safefree(pcVar1);
        sessionname_local = (char *)0x0;
      }
      else {
        safefree(pcVar1);
        sessionname_local = (char *)safemalloc(1,8,0);
        *(FILE **)sessionname_local = pFVar4;
      }
    }
    else {
      pcVar3 = dupprintf("Unable to save session: %s",pcVar2);
      *errmsg = pcVar3;
      safefree(pcVar2);
      safefree(pcVar1);
      sessionname_local = (char *)0x0;
    }
  }
  else {
    pcVar3 = dupprintf("Unable to save session: %s",pcVar2);
    *errmsg = pcVar3;
    safefree(pcVar2);
    safefree(pcVar1);
    sessionname_local = (char *)0x0;
  }
  return (settings_w *)sessionname_local;
}

Assistant:

settings_w *open_settings_w(const char *sessionname, char **errmsg)
{
    char *filename, *err;
    FILE *fp;

    *errmsg = NULL;

    /*
     * Start by making sure the .putty directory and its sessions
     * subdir actually exist.
     */
    filename = make_filename(INDEX_DIR, NULL);
    if ((err = make_dir_path(filename, 0700)) != NULL) {
        *errmsg = dupprintf("Unable to save session: %s", err);
        sfree(err);
        sfree(filename);
        return NULL;
    }
    sfree(filename);

    filename = make_filename(INDEX_SESSIONDIR, NULL);
    if ((err = make_dir_path(filename, 0700)) != NULL) {
        *errmsg = dupprintf("Unable to save session: %s", err);
        sfree(err);
        sfree(filename);
        return NULL;
    }
    sfree(filename);

    filename = make_filename(INDEX_SESSION, sessionname);
    fp = fopen(filename, "w");
    if (!fp) {
        *errmsg = dupprintf("Unable to save session: open(\"%s\") "
                            "returned '%s'", filename, strerror(errno));
        sfree(filename);
        return NULL;                   /* can't open */
    }
    sfree(filename);

    settings_w *toret = snew(settings_w);
    toret->fp = fp;
    return toret;
}